

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

int Lodtalk::Object::stIdentityHash(InterpreterProxy *interpreter)

{
  int iVar1;
  Oop obj;
  Oop receiver;
  InterpreterProxy *interpreter_local;
  undefined4 extraout_var;
  
  obj.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])();
  obj.field_0.uintValue._4_4_ = extraout_var;
  iVar1 = identityHashOf(obj);
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x15])(interpreter,(long)iVar1);
  return iVar1;
}

Assistant:

int Object::stIdentityHash(InterpreterProxy *interpreter)
{
    auto receiver = interpreter->getReceiver();
    return interpreter->returnSmallInteger(identityHashOf(receiver));
}